

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall ncnn::Interp::load_param(Interp *this,ParamDict *pd)

{
  int iVar1;
  ulong uVar2;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar3;
  int blob_count;
  string *in_stack_00000060;
  string *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  ParamDict *in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_38 [32];
  ParamDict *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  fVar3 = ParamDict::get(local_18,1,1.0);
  *(float *)(in_RDI + 0xd8) = fVar3;
  fVar3 = ParamDict::get(local_18,2,1.0);
  *(float *)(in_RDI + 0xd4) = fVar3;
  iVar1 = ParamDict::get(local_18,3,0);
  *(int *)(in_RDI + 0xe0) = iVar1;
  iVar1 = ParamDict::get(local_18,4,0);
  *(int *)(in_RDI + 0xdc) = iVar1;
  iVar1 = ParamDict::get(local_18,5,0);
  *(int *)(in_RDI + 0xe4) = iVar1;
  iVar1 = ParamDict::get(local_18,6,0);
  *(int *)(in_RDI + 0xe8) = iVar1;
  if ((*(int *)(in_RDI + 0xd0) < 0) || (3 < *(int *)(in_RDI + 0xd0))) {
    fprintf(_stderr,"unsupported resize type %d",(ulong)*(uint *)(in_RDI + 0xd0));
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else {
    if (*(int *)(in_RDI + 0xe4) == 1) {
      *(undefined1 *)(in_RDI + 8) = 0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    ParamDict::get(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xf0),local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && (iVar1 = count_expression_blobs(in_stack_00000060), 1 < iVar1)) {
      *(undefined1 *)(in_RDI + 8) = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Interp::load_param(const ParamDict& pd)
{
    resize_type = pd.get(0, 0);
    height_scale = pd.get(1, 1.f);
    width_scale = pd.get(2, 1.f);
    output_height = pd.get(3, 0);
    output_width = pd.get(4, 0);
    dynamic_target_size = pd.get(5, 0);
    align_corner = pd.get(6, 0);

    if (resize_type < 0 || resize_type > 3)
    {
        NCNN_LOGE("unsupported resize type %d", resize_type);
        return -1;
    }

    if (dynamic_target_size == 1)
    {
        one_blob_only = false;
    }

    size_expr = pd.get(9, "");

    // count reference blobs
    if (!size_expr.empty())
    {
        const int blob_count = count_expression_blobs(size_expr);
        if (blob_count > 1)
            one_blob_only = false;
    }

    return 0;
}